

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall ipx::Model::LoadDual(Model *this)

{
  SparseMatrix *this_00;
  uint uVar1;
  size_t sVar2;
  pointer pcVar3;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  Int j_1;
  double *pdVar7;
  double *pdVar8;
  Int i;
  int iVar9;
  ulong uVar10;
  byte bVar11;
  Int j;
  long lVar12;
  double dVar13;
  SparseMatrix local_b0;
  
  this->num_rows_ = this->num_var_;
  this->num_cols_ =
       (int)((ulong)((long)(this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2) + this->num_constr_;
  this->dualized_ = true;
  Transpose(&local_b0,&this->A_);
  this_00 = &this->AI_;
  SparseMatrix::operator=(this_00,&local_b0);
  SparseMatrix::~SparseMatrix(&local_b0);
  for (lVar12 = 0; lVar12 < this->num_var_; lVar12 = lVar12 + 1) {
    if ((ulong)ABS((this->scaled_ubuser_)._M_data[lVar12]) < 0x7ff0000000000000) {
      SparseMatrix::push_back(this_00,(Int)lVar12,-1.0);
      SparseMatrix::add_column(this_00);
    }
  }
  for (iVar9 = 0; iVar9 < this->num_rows_; iVar9 = iVar9 + 1) {
    SparseMatrix::push_back(this_00,iVar9,1.0);
    SparseMatrix::add_column(this_00);
  }
  std::valarray<double>::operator=(&this->b_,&this->scaled_obj_);
  std::valarray<double>::resize(&this->c_,(long)this->num_rows_ + (long)this->num_cols_,0.0);
  pdVar5 = (this->c_)._M_data;
  sVar2 = (this->scaled_rhs_)._M_size;
  pdVar7 = (this->scaled_rhs_)._M_data;
  pdVar8 = pdVar7 + sVar2;
  if (sVar2 == 0) {
    pdVar8 = (double *)0x0;
    pdVar7 = (double *)0x0;
  }
  uVar4 = (ulong)((long)pdVar8 - (long)pdVar7) >> 3;
  for (; pdVar7 != pdVar8; pdVar7 = pdVar7 + 1) {
    *pdVar5 = -*pdVar7;
    pdVar5 = pdVar5 + 1;
  }
  pdVar5 = (this->c_)._M_data;
  sVar2 = (this->scaled_ubuser_)._M_size;
  pdVar7 = (this->scaled_ubuser_)._M_data;
  pdVar8 = pdVar7 + sVar2;
  if (sVar2 == 0) {
    pdVar7 = (double *)0x0;
    pdVar8 = (double *)0x0;
  }
  while( true ) {
    iVar9 = (int)uVar4;
    if (pdVar7 == pdVar8) break;
    if ((ulong)ABS(*pdVar7) < 0x7ff0000000000000) {
      uVar4 = (ulong)(iVar9 + 1);
      pdVar5[iVar9] = *pdVar7;
    }
    pdVar7 = pdVar7 + 1;
  }
  sVar2 = (this->scaled_lbuser_)._M_size;
  pdVar5 = (this->scaled_lbuser_)._M_data;
  pdVar8 = pdVar5 + sVar2;
  if (sVar2 == 0) {
    pdVar8 = (double *)0x0;
    pdVar5 = (double *)0x0;
  }
  pdVar7 = (this->c_)._M_data + iVar9;
  for (; pdVar5 != pdVar8; pdVar5 = pdVar5 + 1) {
    if ((ulong)ABS(*pdVar5) < 0x7ff0000000000000) {
      dVar13 = -*pdVar5;
    }
    else {
      dVar13 = 0.0;
    }
    *pdVar7 = dVar13;
    pdVar7 = pdVar7 + 1;
  }
  std::valarray<double>::resize(&this->lb_,(long)this->num_rows_ + (long)this->num_cols_,0.0);
  std::valarray<double>::resize(&this->ub_,(long)this->num_rows_ + (long)this->num_cols_,0.0);
  uVar1 = this->num_constr_;
  lVar12 = (long)(int)uVar1;
  pcVar3 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->lb_)._M_data;
  pdVar5 = (this->ub_)._M_data;
  uVar4 = 0;
  uVar10 = 0;
  if (0 < (int)uVar1) {
    uVar10 = (ulong)uVar1;
  }
  for (; uVar10 != uVar4; uVar4 = uVar4 + 1) {
    bVar11 = pcVar3[uVar4] - 0x3c;
    if (bVar11 < 3) {
      lVar6 = (ulong)bVar11 * 8;
      dVar13 = *(double *)(&DAT_003b77d0 + lVar6);
      pdVar8[uVar4] = *(double *)(&DAT_003b77b8 + lVar6);
      pdVar5[uVar4] = dVar13;
    }
  }
  lVar6 = (long)this->num_cols_;
  pdVar8 = (this->lb_)._M_data;
  pdVar5 = (this->ub_)._M_data;
  for (; lVar12 < lVar6; lVar12 = lVar12 + 1) {
    pdVar8[lVar12] = 0.0;
    pdVar5[lVar12] = INFINITY;
  }
  pdVar8 = (this->scaled_lbuser_)._M_data;
  uVar10 = 0;
  uVar4 = (ulong)(uint)this->num_var_;
  if (this->num_var_ < 1) {
    uVar4 = uVar10;
  }
  pdVar5 = (this->lb_)._M_data;
  pdVar7 = (this->ub_)._M_data;
  for (; uVar4 != uVar10; uVar10 = uVar10 + 1) {
    pdVar5[lVar6 + uVar10] = 0.0;
    dVar13 = INFINITY;
    if (0x7fefffffffffffff < (ulong)ABS(pdVar8[uVar10])) {
      dVar13 = 0.0;
    }
    pdVar7[lVar6 + uVar10] = dVar13;
  }
  return;
}

Assistant:

void Model::LoadDual() {
    num_rows_ = num_var_;
    num_cols_ = num_constr_ + boxed_vars_.size();
    dualized_ = true;

    // Check that every variable with finite scaled_ubuser_ has finite
    // scaled_lbuser_ (must be the case after scaling).
    for (Int j = 0; j < num_var_; j++) {
        if (std::isfinite(scaled_ubuser_[j]))
            assert(std::isfinite(scaled_lbuser_[j]));
    }

    // Build AI.
    AI_ = Transpose(A_);
    for (Int j = 0; j < num_var_; j++) {
        if (std::isfinite(scaled_ubuser_[j])) {
            AI_.push_back(j, -1.0);
            AI_.add_column();
        }
    }
    assert(AI_.cols() == num_cols_);
    for (Int i = 0; i < num_rows_; i++) {
        AI_.push_back(i, 1.0);
        AI_.add_column();
    }

    // Build vectors.
    b_ = scaled_obj_;
    c_.resize(num_cols_+num_rows_);
    Int put = 0;
    for (double x : scaled_rhs_)
        c_[put++] = -x;
    for (double x : scaled_ubuser_)
        if (std::isfinite(x))
            c_[put++] = x;
    assert(put == num_cols_);
    for (double x : scaled_lbuser_)
        // If x is negative infinity, then the variable will be fixed and we can
        // give it any (finite) cost.
        c_[put++] = std::isfinite(x) ? -x : 0.0;
    lb_.resize(num_cols_+num_rows_);
    ub_.resize(num_cols_+num_rows_);
    for (Int i = 0; i < num_constr_; i++)
        switch(constr_type_[i]) {
        case '=':
            lb_[i] = -INFINITY;
            ub_[i] = INFINITY;
            break;
        case '<':
            lb_[i] = -INFINITY;
            ub_[i] = 0.0;
            break;
        case '>':
            lb_[i] = 0.0;
            ub_[i] = INFINITY;
            break;
        }
    for (Int j = num_constr_; j < num_cols_; j++) {
        lb_[j] = 0.0;
        ub_[j] = INFINITY;
    }
    for (Int j = 0; j < num_var_; j++) {
        lb_[num_cols_+j] = 0.0;
        ub_[num_cols_+j] = std::isfinite(scaled_lbuser_[j]) ? INFINITY : 0.0;
    }
}